

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O2

SUNErrCode SUNMatScaleAdd_Sparse(sunrealtype c,SUNMatrix A,SUNMatrix B)

{
  long *plVar1;
  int sparsetype;
  sunindextype *psVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  void *pvVar9;
  long lVar10;
  long lVar11;
  void *pvVar12;
  void *pvVar13;
  void *__ptr;
  long lVar14;
  SUNMatrix A_00;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  
  psVar2 = (sunindextype *)A->content;
  sparsetype = (int)psVar2[5];
  lVar19 = psVar2[sparsetype == 0];
  lVar17 = psVar2[sparsetype != 0];
  lVar3 = psVar2[7];
  lVar4 = psVar2[6];
  lVar5 = psVar2[4];
  pvVar13 = B->content;
  lVar6 = *(long *)((long)pvVar13 + 0x38);
  lVar7 = *(long *)((long)pvVar13 + 0x20);
  lVar8 = *(long *)((long)pvVar13 + 0x30);
  pvVar13 = malloc(lVar17 * 8);
  __ptr = malloc(lVar17 * 8);
  lVar14 = 0;
  lVar20 = 0;
  if (0 < lVar17) {
    lVar20 = lVar17;
  }
  lVar15 = 0;
  if (0 < lVar19) {
    lVar15 = lVar19;
  }
  lVar18 = 0;
  while (lVar18 != lVar15) {
    for (lVar16 = 0; lVar20 != lVar16; lVar16 = lVar16 + 1) {
      *(undefined8 *)((long)pvVar13 + lVar16 * 8) = 0;
    }
    lVar22 = *(long *)(lVar3 + 8 + lVar18 * 8);
    lVar16 = lVar18 + 1;
    for (lVar21 = *(long *)(lVar3 + lVar18 * 8); lVar21 < lVar22; lVar21 = lVar21 + 1) {
      plVar1 = (long *)((long)pvVar13 + *(long *)(lVar4 + lVar21 * 8) * 8);
      *plVar1 = *plVar1 + 1;
    }
    lVar21 = *(long *)(lVar6 + lVar16 * 8);
    for (lVar18 = *(long *)(lVar6 + lVar18 * 8); lVar18 < lVar21; lVar18 = lVar18 + 1) {
      plVar1 = (long *)((long)pvVar13 + *(long *)(lVar8 + lVar18 * 8) * 8);
      *plVar1 = *plVar1 + -1;
    }
    for (lVar21 = 0; lVar18 = lVar16, lVar20 != lVar21; lVar21 = lVar21 + 1) {
      lVar14 = lVar14 - (*(long *)((long)pvVar13 + lVar21 * 8) >> 0x3f);
    }
  }
  if (lVar14 == 0) {
    lVar19 = 0;
    while (lVar19 != lVar15) {
      for (lVar17 = 0; lVar20 != lVar17; lVar17 = lVar17 + 1) {
        *(undefined8 *)((long)__ptr + lVar17 * 8) = 0;
      }
      lVar18 = *(long *)(lVar6 + 8 + lVar19 * 8);
      lVar17 = lVar19 + 1;
      for (lVar14 = *(long *)(lVar6 + lVar19 * 8); lVar14 < lVar18; lVar14 = lVar14 + 1) {
        *(undefined8 *)((long)__ptr + *(long *)(lVar8 + lVar14 * 8) * 8) =
             *(undefined8 *)(lVar7 + lVar14 * 8);
      }
      lVar18 = *(long *)(lVar3 + lVar17 * 8);
      for (lVar14 = *(long *)(lVar3 + lVar19 * 8); lVar19 = lVar17, lVar14 < lVar18;
          lVar14 = lVar14 + 1) {
        *(double *)(lVar5 + lVar14 * 8) =
             *(double *)(lVar5 + lVar14 * 8) * c +
             *(double *)((long)__ptr + *(long *)(lVar4 + lVar14 * 8) * 8);
      }
    }
  }
  else {
    lVar18 = *(long *)(lVar3 + lVar19 * 8);
    if (psVar2[2] - lVar18 < lVar14) {
      A_00 = SUNSparseMatrix(*psVar2,psVar2[1],lVar18 + lVar14,sparsetype,A->sunctx);
      pvVar9 = A_00->content;
      lVar17 = *(long *)((long)pvVar9 + 0x38);
      lVar14 = *(long *)((long)pvVar9 + 0x20);
      lVar18 = *(long *)((long)pvVar9 + 0x30);
      lVar21 = 0;
      lVar16 = 0;
      while (lVar16 != lVar15) {
        *(long *)(lVar17 + lVar16 * 8) = lVar21;
        for (lVar22 = 0; lVar20 != lVar22; lVar22 = lVar22 + 1) {
          *(undefined8 *)((long)pvVar13 + lVar22 * 8) = 0;
          *(undefined8 *)((long)__ptr + lVar22 * 8) = 0;
        }
        lVar10 = *(long *)(lVar3 + 8 + lVar16 * 8);
        lVar22 = lVar16 + 1;
        for (lVar23 = *(long *)(lVar3 + lVar16 * 8); lVar23 < lVar10; lVar23 = lVar23 + 1) {
          lVar11 = *(long *)(lVar4 + lVar23 * 8);
          plVar1 = (long *)((long)pvVar13 + lVar11 * 8);
          *plVar1 = *plVar1 + 1;
          *(double *)((long)__ptr + lVar11 * 8) = *(double *)(lVar5 + lVar23 * 8) * c;
        }
        lVar23 = *(long *)(lVar6 + lVar22 * 8);
        for (lVar16 = *(long *)(lVar6 + lVar16 * 8); lVar16 < lVar23; lVar16 = lVar16 + 1) {
          lVar10 = *(long *)(lVar8 + lVar16 * 8);
          plVar1 = (long *)((long)pvVar13 + lVar10 * 8);
          *plVar1 = *plVar1 + 1;
          *(double *)((long)__ptr + lVar10 * 8) =
               *(double *)(lVar7 + lVar16 * 8) + *(double *)((long)__ptr + lVar10 * 8);
        }
        for (lVar23 = 0; lVar16 = lVar22, lVar20 != lVar23; lVar23 = lVar23 + 1) {
          if (0 < *(long *)((long)pvVar13 + lVar23 * 8)) {
            *(long *)(lVar18 + lVar21 * 8) = lVar23;
            *(undefined8 *)(lVar14 + lVar21 * 8) = *(undefined8 *)((long)__ptr + lVar23 * 8);
            lVar21 = lVar21 + 1;
          }
        }
      }
      *(long *)(lVar17 + lVar19 * 8) = lVar21;
      pvVar12 = A->content;
      *(undefined8 *)((long)pvVar12 + 0x10) = *(undefined8 *)((long)pvVar9 + 0x10);
      free(*(void **)((long)pvVar12 + 0x20));
      pvVar9 = A_00->content;
      pvVar12 = A->content;
      *(undefined8 *)((long)pvVar12 + 0x20) = *(undefined8 *)((long)pvVar9 + 0x20);
      *(undefined8 *)((long)pvVar9 + 0x20) = 0;
      free(*(void **)((long)pvVar12 + 0x30));
      pvVar9 = A_00->content;
      pvVar12 = A->content;
      *(undefined8 *)((long)pvVar12 + 0x30) = *(undefined8 *)((long)pvVar9 + 0x30);
      *(undefined8 *)((long)pvVar9 + 0x30) = 0;
      free(*(void **)((long)pvVar12 + 0x38));
      pvVar9 = A_00->content;
      *(undefined8 *)((long)A->content + 0x38) = *(undefined8 *)((long)pvVar9 + 0x38);
      *(undefined8 *)((long)pvVar9 + 0x38) = 0;
      SUNMatDestroy_Sparse(A_00);
    }
    else {
      lVar14 = lVar14 + lVar18;
      *(long *)(lVar3 + lVar19 * 8) = lVar14;
      while (0 < lVar19) {
        lVar15 = lVar19 + -1;
        for (lVar16 = 0; lVar20 != lVar16; lVar16 = lVar16 + 1) {
          *(undefined8 *)((long)pvVar13 + lVar16 * 8) = 0;
          *(undefined8 *)((long)__ptr + lVar16 * 8) = 0;
        }
        for (lVar16 = *(long *)(lVar3 + lVar15 * 8); lVar16 < lVar18; lVar16 = lVar16 + 1) {
          lVar21 = *(long *)(lVar4 + lVar16 * 8);
          plVar1 = (long *)((long)pvVar13 + lVar21 * 8);
          *plVar1 = *plVar1 + 1;
          *(double *)((long)__ptr + lVar21 * 8) = *(double *)(lVar5 + lVar16 * 8) * c;
        }
        lVar18 = *(long *)(lVar6 + lVar19 * 8);
        for (lVar19 = *(long *)(lVar6 + lVar15 * 8); lVar16 = lVar17, lVar19 < lVar18;
            lVar19 = lVar19 + 1) {
          lVar16 = *(long *)(lVar8 + lVar19 * 8);
          plVar1 = (long *)((long)pvVar13 + lVar16 * 8);
          *plVar1 = *plVar1 + 1;
          *(double *)((long)__ptr + lVar16 * 8) =
               *(double *)(lVar7 + lVar19 * 8) + *(double *)((long)__ptr + lVar16 * 8);
        }
        while (0 < lVar16) {
          lVar19 = lVar16 + -1;
          lVar18 = lVar16 * 8;
          lVar16 = lVar19;
          if (0 < *(long *)((long)pvVar13 + lVar18 + -8)) {
            *(long *)(lVar4 + -8 + lVar14 * 8) = lVar19;
            *(undefined8 *)(lVar5 + -8 + lVar14 * 8) = *(undefined8 *)((long)__ptr + lVar19 * 8);
            lVar14 = lVar14 + -1;
          }
        }
        lVar18 = *(long *)(lVar3 + lVar15 * 8);
        *(long *)(lVar3 + lVar15 * 8) = lVar14;
        lVar19 = lVar15;
      }
    }
  }
  free(pvVar13);
  free(__ptr);
  return 0;
}

Assistant:

SUNErrCode SUNMatScaleAdd_Sparse(sunrealtype c, SUNMatrix A, SUNMatrix B)
{
  sunindextype j, i, p, nz, newvals, M, N, cend;
  sunbooleantype newmat;
  sunindextype *w, *Ap, *Ai, *Bp, *Bi, *Cp, *Ci;
  sunrealtype *x, *Ax, *Bx, *Cx;
  SUNMatrix C;
  SUNFunctionBegin(A->sunctx);

  SUNAssert(SUNMatGetID(A) == SUNMATRIX_SPARSE, SUN_ERR_ARG_WRONGTYPE);
  SUNAssert(SUNMatGetID(B) == SUNMATRIX_SPARSE, SUN_ERR_ARG_WRONGTYPE);
  SUNCheck(compatibleMatrices(A, B), SUN_ERR_ARG_DIMSMISMATCH);

  /* store shortcuts to matrix dimensions (M is inner dimension, N is outer) */
  if (SM_SPARSETYPE_S(A) == CSC_MAT)
  {
    M = SM_ROWS_S(A);
    N = SM_COLUMNS_S(A);
  }
  else
  {
    M = SM_COLUMNS_S(A);
    N = SM_ROWS_S(A);
  }

  /* access data arrays from A and B (return if failure) */
  Ap = Ai = Bp = Bi = NULL;
  Ax = Bx = NULL;
  Ap      = SM_INDEXPTRS_S(A);
  SUNAssert(Ap, SUN_ERR_ARG_CORRUPT);
  Ai = SM_INDEXVALS_S(A);
  SUNAssert(Ai, SUN_ERR_ARG_CORRUPT);
  Ax = SM_DATA_S(A);
  SUNAssert(Ax, SUN_ERR_ARG_CORRUPT);
  Bp = SM_INDEXPTRS_S(B);
  SUNAssert(Bp, SUN_ERR_ARG_CORRUPT);
  Bi = SM_INDEXVALS_S(B);
  SUNAssert(Bi, SUN_ERR_ARG_CORRUPT);
  Bx = SM_DATA_S(B);
  SUNAssert(Bx, SUN_ERR_ARG_CORRUPT);

  /* create work arrays for row indices and nonzero column values */
  w = (sunindextype*)malloc(M * sizeof(sunindextype));
  SUNAssert(w, SUN_ERR_MALLOC_FAIL);
  x = (sunrealtype*)malloc(M * sizeof(sunrealtype));
  SUNAssert(x, SUN_ERR_MALLOC_FAIL);

  /* determine if A already contains the sparsity pattern of B */
  newvals = 0;
  for (j = 0; j < N; j++)
  {
    /* clear work array */
    for (i = 0; i < M; i++) { w[i] = 0; }

    /* scan column of A, incrementing w by one */
    for (i = Ap[j]; i < Ap[j + 1]; i++) { w[Ai[i]] += 1; }

    /* scan column of B, decrementing w by one */
    for (i = Bp[j]; i < Bp[j + 1]; i++) { w[Bi[i]] -= 1; }

    /* if any entry of w is negative, A doesn't contain B's sparsity,
       so increment necessary storage counter */
    for (i = 0; i < M; i++)
    {
      if (w[i] < 0) { newvals += 1; }
    }
  }

  /* If extra nonzeros required, check whether A has sufficient storage space
     for new nonzero entries (so B can be inserted into existing storage) */
  newmat = SUNFALSE; /* no reallocation needed */
  if (newvals > (SM_NNZ_S(A) - Ap[N])) { newmat = SUNTRUE; }

  /* perform operation based on existing/necessary structure */

  /*   case 1: A already contains sparsity pattern of B */
  if (newvals == 0)
  {
    /* iterate through columns, adding matrices */
    for (j = 0; j < N; j++)
    {
      /* clear work array */
      for (i = 0; i < M; i++) { x[i] = ZERO; }

      /* scan column of B, updating work array */
      for (i = Bp[j]; i < Bp[j + 1]; i++) { x[Bi[i]] = Bx[i]; }

      /* scan column of A, updating array entries appropriately */
      for (i = Ap[j]; i < Ap[j + 1]; i++) { Ax[i] = c * Ax[i] + x[Ai[i]]; }
    }

    /*   case 2: A has sufficient storage, but does not already contain B's
     * sparsity */
  }
  else if (!newmat)
  {
    /* determine storage location where last column (row) should end */
    nz = Ap[N] + newvals;

    /* store pointer past last column (row) from original A,
       and store updated value in revised A */
    cend  = Ap[N];
    Ap[N] = nz;

    /* iterate through columns (rows) backwards */
    for (j = N - 1; j >= 0; j--)
    {
      /* clear out temporary arrays for this column (row) */
      for (i = 0; i < M; i++)
      {
        w[i] = 0;
        x[i] = SUN_RCONST(0.0);
      }

      /* iterate down column (row) of A, collecting nonzeros */
      for (p = Ap[j]; p < cend; p++)
      {
        w[Ai[p]] += 1;        /* indicate that row (column) is filled */
        x[Ai[p]] = c * Ax[p]; /* collect/scale value */
      }

      /* iterate down column of B, collecting nonzeros */
      for (p = Bp[j]; p < Bp[j + 1]; p++)
      {
        w[Bi[p]] += 1;     /* indicate that row is filled */
        x[Bi[p]] += Bx[p]; /* collect value */
      }

      /* fill entries of A with this column's (row's) data */
      for (i = M - 1; i >= 0; i--)
      {
        if (w[i] > 0)
        {
          Ai[--nz] = i;
          Ax[nz]   = x[i];
        }
      }

      /* store ptr past this col (row) from orig A, update value for new A */
      cend  = Ap[j];
      Ap[j] = nz;
    }

    /*   case 3: A must be reallocated with sufficient storage */
  }
  else
  {
    /* create new matrix for sum */
    C = SUNSparseMatrix(SM_ROWS_S(A), SM_COLUMNS_S(A), Ap[N] + newvals,
                        SM_SPARSETYPE_S(A), A->sunctx);
    SUNCheckLastErr();

    /* access data from CSR structures (return if failure) */
    Cp = NULL;
    Ci = NULL;
    Cx = NULL;
    Cp = SM_INDEXPTRS_S(C);
    SUNAssert(Cp, SUN_ERR_ARG_CORRUPT);
    Ci = SM_INDEXVALS_S(C);
    SUNAssert(Ci, SUN_ERR_ARG_CORRUPT);
    Cx = SM_DATA_S(C);
    SUNAssert(Cx, SUN_ERR_ARG_CORRUPT);

    /* initialize total nonzero count */
    nz = 0;

    /* iterate through columns (rows) */
    for (j = 0; j < N; j++)
    {
      /* set current column (row) pointer to current # nonzeros */
      Cp[j] = nz;

      /* clear out temporary arrays for this column (row) */
      for (i = 0; i < M; i++)
      {
        w[i] = 0;
        x[i] = SUN_RCONST(0.0);
      }

      /* iterate down column of A, collecting nonzeros */
      for (p = Ap[j]; p < Ap[j + 1]; p++)
      {
        w[Ai[p]] += 1;        /* indicate that row is filled */
        x[Ai[p]] = c * Ax[p]; /* collect/scale value */
      }

      /* iterate down column of B, collecting nonzeros */
      for (p = Bp[j]; p < Bp[j + 1]; p++)
      {
        w[Bi[p]] += 1;     /* indicate that row is filled */
        x[Bi[p]] += Bx[p]; /* collect value */
      }

      /* fill entries of C with this column's data */
      for (i = 0; i < M; i++)
      {
        if (w[i] > 0)
        {
          Ci[nz]   = i;
          Cx[nz++] = x[i];
        }
      }
    }

    /* indicate end of data */
    Cp[N] = nz;

    /* update A's structure with C's values; nullify C's pointers */
    SM_NNZ_S(A) = SM_NNZ_S(C);

    free(SM_DATA_S(A));
    SM_DATA_S(A) = SM_DATA_S(C);
    SM_DATA_S(C) = NULL;

    free(SM_INDEXVALS_S(A));
    SM_INDEXVALS_S(A) = SM_INDEXVALS_S(C);
    SM_INDEXVALS_S(C) = NULL;

    free(SM_INDEXPTRS_S(A));
    SM_INDEXPTRS_S(A) = SM_INDEXPTRS_S(C);
    SM_INDEXPTRS_S(C) = NULL;

    /* clean up */
    SUNMatDestroy_Sparse(C);
  }

  /* clean up */
  free(w);
  free(x);

  /* return success */
  return SUN_SUCCESS;
}